

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EhFrame.cpp
# Opt level: O0

void __thiscall EhFrame::Entry::End(Entry *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t sVar4;
  ulong uStack_20;
  uword length;
  size_t i;
  size_t padding;
  Entry *this_local;
  
  if (this->beginOffset == 0xffffffffffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EhFrame.cpp"
                       ,0x7a,"(beginOffset != -1)","beginOffset != -1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  sVar4 = Writer::Count(this->writer);
  for (uStack_20 = 0; uStack_20 < (8 - (sVar4 & 7) & 7); uStack_20 = uStack_20 + 1) {
    cfi_nop(this);
  }
  sVar4 = Writer::Count(this->writer);
  Writer::Write<unsigned_int>
            (this->writer,this->beginOffset,((int)sVar4 - (int)this->beginOffset) - 4);
  return;
}

Assistant:

void EhFrame::Entry::End()
{
    Assert(beginOffset != -1); // Must have called Begin()

    // padding
    size_t padding = (MachPtr - writer->Count() % MachPtr) % MachPtr;
    for (size_t i = 0; i < padding; i++)
    {
        cfi_nop();
    }

    // update length record
    uword length = writer->Count() - beginOffset
                    - sizeof(length);  // exclude length itself
    writer->Write(beginOffset, length);
}